

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

int load_obj(em8051 *aCPU,char *aFilename)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  FILE *__stream;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  
  iVar1 = -1;
  if (((aFilename != (char *)0x0) && (*aFilename != '\0')) &&
     (__stream = fopen(aFilename,"r"), __stream != (FILE *)0x0)) {
    iVar1 = fgetc(__stream);
    if (iVar1 == 0x3a) {
LAB_00104344:
      iVar1 = feof(__stream);
      if (iVar1 == 0) {
        uVar2 = readbyte((FILE *)__stream);
        iVar1 = readbyte((FILE *)__stream);
        uVar3 = readbyte((FILE *)__stream);
        iVar4 = readbyte((FILE *)__stream);
        if (iVar4 != 0) {
          if (iVar4 != 1) {
            return -3;
          }
          return 0;
        }
        uVar6 = iVar1 << 8 | uVar3;
        iVar1 = ((int)uVar6 >> 8) + uVar3 + uVar2;
        if (0 < (int)uVar2) {
          lVar7 = (long)(int)uVar6;
          uVar5 = (ulong)uVar2;
          do {
            iVar4 = readbyte((FILE *)__stream);
            iVar1 = iVar1 + iVar4;
            aCPU->mCodeMem[lVar7] = (uchar)iVar4;
            lVar7 = lVar7 + 1;
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        uVar2 = readbyte((FILE *)__stream);
        if (uVar2 != (-iVar1 & 0xffU)) {
          return -4;
        }
        do {
          iVar1 = fgetc(__stream);
          if (iVar1 == 0x3a) break;
          iVar1 = feof(__stream);
        } while (iVar1 == 0);
        goto LAB_00104344;
      }
      fclose(__stream);
      iVar1 = -5;
    }
    else {
      fclose(__stream);
      iVar1 = -2;
    }
  }
  return iVar1;
}

Assistant:

int load_obj(struct em8051 *aCPU, char *aFilename)
{
    FILE *f;    
    if (aFilename == 0 || aFilename[0] == 0)
        return -1;
    f = fopen(aFilename, "r");
    if (!f) return -1;
    if (fgetc(f) != ':')
    {
    	  fclose(f);
        return -2; // unsupported file format
    }
    while (!feof(f))
    {
        int recordlength;
        int address;
        int recordtype;
        int checksum;
        int i;
        recordlength = readbyte(f);
        address = readbyte(f);
        address <<= 8;
        address |= readbyte(f);
        recordtype = readbyte(f);
        if (recordtype == 1)
            return 0; // we're done
        if (recordtype != 0)
            return -3; // unsupported record type
        checksum = recordtype + recordlength + (address & 0xff) + (address >> 8); // final checksum = 1 + not(checksum)
        for (i = 0; i < recordlength; i++)
        {
            int data = readbyte(f);
            checksum += data;
            aCPU->mCodeMem[address + i] = data;
        }
        i = readbyte(f);
        checksum &= 0xff;
        checksum = 256 - checksum;
        if (i != (checksum & 0xff))
            return -4; // checksum failure
        while (fgetc(f) != ':' && !feof(f)) {} // skip newline        
    }
	  fclose(f);
    return -5;
}